

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O0

bool __thiscall QBmpHandler::canRead(QBmpHandler *this)

{
  long lVar1;
  bool bVar2;
  QBmpHandler *in_RDI;
  long in_FS_OFFSET;
  QIODevice *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_format == BmpFormat) && (in_RDI->state == Ready)) {
    QImageIOHandler::device
              ((QImageIOHandler *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    bVar2 = canRead(in_stack_ffffffffffffffb8);
    if (!bVar2) {
      local_21 = false;
      goto LAB_00283522;
    }
  }
  if (in_RDI->state == Error) {
    local_21 = false;
  }
  else {
    formatName(in_RDI);
    QImageIOHandler::setFormat
              ((QImageIOHandler *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               (QByteArray *)in_stack_ffffffffffffffb8);
    QByteArray::~QByteArray((QByteArray *)0x283516);
    local_21 = true;
  }
LAB_00283522:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QBmpHandler::canRead() const
{
    if (m_format == BmpFormat && state == Ready && !canRead(device()))
        return false;

    if (state != Error) {
        setFormat(formatName());
        return true;
    }

    return false;
}